

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

int __thiscall
soplex::CLUFactor<double>::vSolveUright
          (CLUFactor<double> *this,double *vec,int *vidx,double *rhs,int *ridx,int rn,double eps)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  int iVar9;
  double *pdVar10;
  reference pvVar11;
  long in_RCX;
  long in_RDX;
  int iVar12;
  long in_RSI;
  double in_RDI;
  int *in_R8;
  int in_R9D;
  double dVar13;
  double dVar14;
  double *val;
  int *idx;
  double y;
  double x;
  double *cval;
  int *cbeg;
  int *clen;
  int *cidx;
  int *rperm;
  int *corig;
  int *rorig;
  int n;
  int c;
  int r;
  int k;
  int j;
  int i;
  double in_stack_ffffffffffffff48;
  double *local_a8;
  int *local_a0;
  int local_50;
  int local_40;
  int local_3c;
  int local_2c;
  int *local_28;
  long local_20;
  long local_18;
  long local_10;
  
  lVar2 = *(long *)((long)in_RDI + 0x38);
  lVar3 = *(long *)((long)in_RDI + 0x48);
  lVar4 = *(long *)((long)in_RDI + 0x40);
  lVar5 = *(long *)((long)in_RDI + 0x180);
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pdVar10 = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x25cde8);
  lVar6 = *(long *)((long)in_RDI + 0x1a8);
  lVar7 = *(long *)((long)in_RDI + 0x1a0);
  local_50 = 0;
  do {
    do {
      if (local_2c < 1) {
        return local_50;
      }
      iVar9 = deQueueMax(local_28,&local_2c);
      iVar1 = *(int *)(lVar2 + (long)iVar9 * 4);
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)((long)in_RDI + 0xe0),
                           (long)iVar1);
      dVar13 = *pvVar11 * *(double *)(local_20 + (long)iVar1 * 8);
      *(undefined8 *)(local_20 + (long)iVar1 * 8) = 0;
      bVar8 = isNotZero<double,double>(in_RDI,in_stack_ffffffffffffff48);
    } while (!bVar8);
    iVar1 = *(int *)(lVar3 + (long)iVar9 * 4);
    iVar12 = local_50 + 1;
    *(int *)(local_18 + (long)local_50 * 4) = iVar1;
    *(double *)(local_10 + (long)iVar1 * 8) = dVar13;
    local_a8 = pdVar10 + *(int *)(lVar7 + (long)iVar1 * 4);
    local_a0 = (int *)(lVar5 + (long)*(int *)(lVar7 + (long)iVar1 * 4) * 4);
    local_40 = *(int *)(lVar6 + (long)iVar1 * 4);
    while (0 < local_40) {
      iVar1 = *local_a0;
      dVar14 = *(double *)(local_20 + (long)iVar1 * 8);
      if ((dVar14 != 0.0) || (NAN(dVar14))) {
        dVar14 = dVar14 - dVar13 * *local_a8;
        *(double *)(local_20 + (long)iVar1 * 8) =
             (double)(-(ulong)(dVar14 == 0.0) & 0x2b2bff2ee48e0530) + dVar14;
      }
      else {
        dVar14 = *local_a8;
        bVar8 = isNotZero<double,double>(in_RDI,in_stack_ffffffffffffff48);
        if (bVar8) {
          *(double *)(local_20 + (long)iVar1 * 8) = -dVar13 * dVar14;
          enQueueMax(local_28,&local_2c,*(int *)(lVar4 + (long)iVar1 * 4));
        }
      }
      local_a8 = local_a8 + 1;
      local_a0 = local_a0 + 1;
      local_40 = local_40 + -1;
    }
    local_50 = iVar12;
  } while ((double)local_2c <= (double)iVar9 * 0.2);
  for (local_3c = *local_28; -1 < local_3c; local_3c = local_3c + -1) {
    iVar1 = *(int *)(lVar2 + (long)local_3c * 4);
    pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)((long)in_RDI + 0xe0),
                         (long)iVar1);
    dVar13 = *pvVar11 * *(double *)(local_20 + (long)iVar1 * 8);
    *(undefined8 *)(local_20 + (long)iVar1 * 8) = 0;
    bVar8 = isNotZero<double,double>(in_RDI,in_stack_ffffffffffffff48);
    if (bVar8) {
      iVar1 = *(int *)(lVar3 + (long)local_3c * 4);
      iVar9 = local_50 + 1;
      *(int *)(local_18 + (long)local_50 * 4) = iVar1;
      *(double *)(local_10 + (long)iVar1 * 8) = dVar13;
      local_a8 = pdVar10 + *(int *)(lVar7 + (long)iVar1 * 4);
      local_a0 = (int *)(lVar5 + (long)*(int *)(lVar7 + (long)iVar1 * 4) * 4);
      local_40 = *(int *)(lVar6 + (long)iVar1 * 4);
      while (local_50 = iVar9, 0 < local_40) {
        *(double *)(local_20 + (long)*local_a0 * 8) =
             *(double *)(local_20 + (long)*local_a0 * 8) - dVar13 * *local_a8;
        local_a8 = local_a8 + 1;
        local_a0 = local_a0 + 1;
        local_40 = local_40 + -1;
      }
    }
  }
  return local_50;
}

Assistant:

int CLUFactor<R>::vSolveUright(R* vec, int* vidx,
                               R* rhs, int* ridx, int rn, R eps)
{
   int i, j, k, r, c, n;
   int* rorig, *corig;
   int* rperm;
   int* cidx, *clen, *cbeg;
   R* cval;
   R x, y;

   int* idx;
   R* val;

   rorig = row.orig;
   corig = col.orig;
   rperm = row.perm;

   cidx = u.col.idx;
   cval = u.col.val.data();
   clen = u.col.len;
   cbeg = u.col.start;

   n = 0;

   while(rn > 0)
   {
      /*      Find nonzero with highest permuted row index and setup i and r
       */
      i = deQueueMax(ridx, &rn);
      assert(i >= 0 && i < thedim);
      r = rorig[i];
      assert(r >= 0 && r < thedim);

      x = diag[r] * rhs[r];
      rhs[r] = 0;

      if(isNotZero(x, eps))
      {
         c = corig[i];
         assert(c >= 0 && c < thedim);
         vidx[n++] = c;
         vec[c] = x;
         val = &cval[cbeg[c]];
         idx = &cidx[cbeg[c]];
         j = clen[c];

         while(j-- > 0)
         {
            assert(*idx >= 0 && *idx < thedim);
            k = *idx++;
            assert(k >= 0 && k < thedim);
            y = rhs[k];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[k] = y;
                  enQueueMax(ridx, &rn, rperm[k]);
               }
            }
            else
            {
               y -= x * (*val++);
               y += (y == 0) ? SOPLEX_FACTOR_MARKER : 0;
               rhs[k] = y;
            }
         }

         if(rn > i * verySparseFactor4right)
         {
            /* continue with dense case */
            for(i = *ridx; i >= 0; --i)
            {
               r = rorig[i];
               assert(r >= 0 && r < thedim);
               x = diag[r] * rhs[r];
               rhs[r] = 0;

               if(isNotZero(x, eps))
               {
                  c = corig[i];
                  assert(c >= 0 && c < thedim);
                  vidx[n++] = c;
                  vec[c] = x;
                  val = &cval[cbeg[c]];
                  idx = &cidx[cbeg[c]];
                  j = clen[c];

                  while(j-- > 0)
                  {
                     assert(*idx >= 0 && *idx < thedim);
                     rhs[*idx++] -= x * (*val++);
                  }
               }
            }

            break;
         }
      }
   }

   return n;
}